

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int input_insn_var_iterator_next
              (gen_ctx_t gen_ctx,insn_var_iterator_t *iter,MIR_reg_t *var,int *op_num)

{
  char cVar1;
  MIR_reg_t MVar2;
  size_t sVar3;
  MIR_insn_t pMVar4;
  ulong uVar5;
  int out_p;
  
  uVar5 = iter->op_num;
  do {
    while( true ) {
      if (iter->nops <= uVar5) {
        return 0;
      }
      *op_num = (int)uVar5;
      MIR_insn_op_mode(gen_ctx->ctx,iter->insn,uVar5,&out_p);
      sVar3 = iter->op_num;
      pMVar4 = iter->insn;
      if ((out_p == 0) || (pMVar4->ops[sVar3].field_0x8 == '\v')) break;
      uVar5 = sVar3 + 1;
      iter->op_num = uVar5;
    }
    uVar5 = iter->op_part_num;
    while (uVar5 < 2) {
      cVar1 = pMVar4->ops[sVar3].field_0x8;
      if (cVar1 != '\v') {
        if ((uVar5 != 1) && (cVar1 == '\x02')) {
          *var = pMVar4->ops[sVar3].u.reg;
LAB_001383e9:
          iter->op_part_num = uVar5 + 1;
          return 1;
        }
        break;
      }
      MVar2 = *(MIR_reg_t *)((long)&pMVar4->ops[sVar3].u + (ulong)(uVar5 != 0) * 4 + 0x10);
      *var = MVar2;
      if (MVar2 != 0xffffffff) goto LAB_001383e9;
      uVar5 = uVar5 + 1;
      iter->op_part_num = uVar5;
    }
    uVar5 = sVar3 + 1;
    iter->op_num = uVar5;
    iter->op_part_num = 0;
  } while( true );
}

Assistant:

static inline int input_insn_var_iterator_next (gen_ctx_t gen_ctx, insn_var_iterator_t *iter,
                                                MIR_reg_t *var, int *op_num) {
  MIR_op_t *op_ref;
  int out_p;

  while (iter->op_num < iter->nops) {
    *op_num = (int) iter->op_num;
    MIR_insn_op_mode (gen_ctx->ctx, iter->insn, iter->op_num, &out_p);
    op_ref = &iter->insn->ops[iter->op_num];
    if (out_p && op_ref->mode != MIR_OP_VAR_MEM) {
      iter->op_num++;
      continue;
    }
    while (iter->op_part_num < 2) {
      if (op_ref->mode == MIR_OP_VAR_MEM) {
        *var = iter->op_part_num == 0 ? op_ref->u.var_mem.base : op_ref->u.var_mem.index;
        if (*var == MIR_NON_VAR) {
          iter->op_part_num++;
          continue;
        }
      } else if (iter->op_part_num > 0) {
        break;
      } else if (op_ref->mode == MIR_OP_VAR) {
        *var = op_ref->u.var;
      } else
        break;
      iter->op_part_num++;
      return TRUE;
    }
    iter->op_num++;
    iter->op_part_num = 0;
  }
  return FALSE;
}